

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseFalse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          EncodedInputStream<rapidjson::UTF8<char>,_rapidjson::MemoryStream> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  char *pcVar1;
  MemoryStream *pMVar2;
  char *pcVar3;
  char *pcVar4;
  Ch *pCVar5;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar6;
  char *pcVar7;
  
  pMVar2 = is->is_;
  pcVar3 = pMVar2->src_;
  pcVar4 = pMVar2->end_;
  if ((pcVar3 == pcVar4) || (*pcVar3 != 'f')) {
    ParseFalse<0u,rapidjson::EncodedInputStream<rapidjson::UTF8<char>,rapidjson::MemoryStream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              ();
  }
  else {
    pcVar1 = pcVar3 + 1;
    pMVar2->src_ = pcVar1;
    pcVar7 = pcVar4;
    if ((pcVar1 != pcVar4) && (pcVar7 = pcVar1, *pcVar1 == 'a')) {
      pcVar1 = pcVar3 + 2;
      pMVar2->src_ = pcVar1;
      pcVar7 = pcVar4;
      if ((pcVar1 != pcVar4) && (pcVar7 = pcVar1, *pcVar1 == 'l')) {
        pcVar1 = pcVar3 + 3;
        pMVar2->src_ = pcVar1;
        pcVar7 = pcVar4;
        if ((pcVar1 != pcVar4) && (pcVar7 = pcVar1, *pcVar1 == 's')) {
          pcVar1 = pcVar3 + 4;
          pMVar2->src_ = pcVar1;
          pcVar7 = pcVar4;
          if ((pcVar1 != pcVar4) && (pcVar7 = pcVar1, *pcVar1 == 'e')) {
            pMVar2->src_ = pcVar3 + 5;
            pGVar6 = internal::Stack<rapidjson::CrtAllocator>::
                     Push<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
                               (&handler->stack_,1);
            (pGVar6->data_).n = (Number)0x0;
            (pGVar6->data_).s.str = (Ch *)0x0;
            (pGVar6->data_).f.flags = 9;
            return;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) == 0) {
      pCVar5 = pMVar2->begin_;
      *(undefined4 *)(this + 0x30) = 3;
      *(long *)(this + 0x38) = (long)pcVar7 - (long)pCVar5;
      return;
    }
  }
  __assert_fail("!HasParseError()",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/rapidjson/include/rapidjson/reader.h"
                ,0x37b,
                "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::EncodedInputStream<UTF8<>, MemoryStream>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
               );
}

Assistant:

void ParseFalse(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'f');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'a') && Consume(is, 'l') && Consume(is, 's') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(false)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }